

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O3

int htmlParseCharData(htmlParserCtxtPtr ctxt,int partial)

{
  ulong uVar1;
  ulong uVar2;
  byte bVar3;
  byte bVar4;
  xmlParserInputPtr pxVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  xmlChar *pxVar9;
  uint uVar10;
  uint mode;
  ulong uVar11;
  int iVar12;
  byte *pbVar13;
  int iVar14;
  ulong uVar15;
  uint uVar16;
  long lVar17;
  byte *pbVar18;
  ulong uVar19;
  ulong uVar20;
  byte *pbVar21;
  byte *str;
  size_t oldAvail;
  ulong len;
  xmlParserInputPtr pxVar22;
  bool bVar23;
  int skip;
  int replSize;
  xmlChar utf8Char [4];
  int local_9c;
  ulong local_90;
  int local_6c;
  xmlParserInputPtr local_68;
  int local_60;
  int local_5c;
  uint local_58;
  int local_54;
  ulong local_50;
  xmlChar *local_48;
  byte *local_40;
  int local_38;
  xmlChar local_34 [4];
  
  pxVar22 = ctxt->input;
  mode = ctxt->endCheckState;
  local_38 = pxVar22->line;
  uVar10 = pxVar22->col;
  local_90 = (ulong)uVar10;
  if (1 < ctxt->disableSAX) {
    local_54 = 0;
LAB_0016b674:
    pxVar22->line = local_38;
    pxVar22->col = uVar10;
    uVar10 = 0;
    if (local_54 == 0) {
      uVar10 = mode;
    }
    ctxt->endCheckState = uVar10;
    return local_54;
  }
  uVar16 = pxVar22->flags & 0x40;
  local_54 = 0;
  local_68 = pxVar22;
  local_60 = partial;
LAB_0016ab22:
  local_6c = 0;
  pbVar18 = pxVar22->cur;
  local_5c = 0;
  len = (long)pxVar22->end - (long)pbVar18;
  local_9c = 0;
  uVar15 = 0;
  iVar7 = 0;
  local_48 = "";
  pbVar13 = pbVar18;
LAB_0016ab4d:
  pxVar22 = local_68;
  iVar14 = (int)uVar15;
  pbVar21 = pbVar13;
  uVar8 = len;
  if (len < 0x41) {
    if (uVar16 == 0) {
      lVar17 = (long)pbVar18 - (long)pbVar13;
      local_68->cur = pbVar13;
      xmlParserGrow(ctxt);
      pbVar13 = pxVar22->cur;
      pbVar18 = pbVar13 + lVar17;
      pxVar22->cur = pbVar18;
      uVar8 = (long)pxVar22->end - (long)pbVar13;
      uVar16 = (uint)(len == uVar8);
    }
    pbVar21 = pbVar13;
    if (uVar8 == 0) {
      bVar23 = true;
      if (local_60 == 0 || iVar7 == 0) goto LAB_0016b2b1;
      pbVar13 = pbVar13 + -(long)iVar14;
      bVar23 = true;
      pxVar22 = local_68;
      iVar7 = 0;
      goto LAB_0016b2f6;
    }
  }
  iVar6 = local_60;
  pxVar22 = local_68;
  iVar12 = (int)local_90;
  if (iVar7 == 0) {
    str = pbVar21 + uVar8;
    uVar11 = 0;
    uVar20 = local_90 & 0xffffffff;
    pbVar13 = pbVar21;
    do {
      bVar3 = pbVar21[uVar11];
      if ((htmlParseCharData::mask[bVar3 >> 5] >> (bVar3 & 0x1f) & 1) != 0) {
        len = uVar8 - uVar11;
        str = pbVar21 + uVar11;
        uVar19 = local_90 & 0xffffffff;
        if ((uVar16 == 0) && (len < 0x41)) {
          local_90 = uVar19 + uVar11 & 0xffffffff;
          uVar16 = 0;
          goto LAB_0016ac82;
        }
        uVar1 = uVar8 - 1;
        uVar20 = (ulong)((int)uVar20 + 1);
        local_50 = uVar19 + uVar11 + 1;
        iVar14 = (int)uVar11;
        local_90 = local_50;
        if (bVar3 < 0x26) {
          if (bVar3 != 10) {
            if (bVar3 == 0) {
              local_6c = 1;
              local_5c = 3;
              pbVar13 = pbVar21 + uVar11;
              local_90 = (ulong)(iVar12 + iVar14 + 1);
              bVar23 = false;
              iVar7 = 1;
              local_48 = (xmlChar *)anon_var_dwarf_11e17;
              goto LAB_0016b2b6;
            }
            if (bVar3 == 0xd) {
              pbVar13 = pbVar21 + uVar11;
              local_90 = uVar19 + uVar11 + 1;
              if ((local_60 == 0) || (uVar1 != uVar11)) {
                local_6c = 1;
                if (pbVar21[uVar11 + 1] == 10) {
                  bVar23 = false;
                  iVar7 = 1;
                }
                else {
                  local_5c = 1;
                  bVar23 = false;
                  iVar7 = 1;
                  local_48 = "\n";
                }
              }
              else {
LAB_0016b524:
                iVar7 = 0;
                bVar23 = true;
              }
              goto LAB_0016b2b6;
            }
LAB_0016ad5c:
            if (-1 < (char)bVar3) {
              uVar10 = 1;
              iVar7 = 0;
              goto LAB_0016ac4f;
            }
            if ((local_68->flags & 1) == 0) {
              pbVar13 = pbVar21 + uVar11;
              local_90 = uVar19 + uVar11 + 1;
              if (pbVar18 < pbVar13) {
                iVar7 = 0;
                bVar23 = false;
                goto LAB_0016b2b6;
              }
              pxVar9 = htmlFindEncoding(ctxt);
              if (pxVar9 == (xmlChar *)0x0) {
                xmlSwitchEncoding(ctxt,XML_CHAR_ENCODING_8859_1);
              }
              else {
                xmlSwitchEncodingName(ctxt,(char *)pxVar9);
                (*xmlFree)(pxVar9);
              }
              *(byte *)&local_68->flags = (byte)local_68->flags | 1;
              uVar16 = ctxt->input->flags & 0x40;
              pxVar22 = local_68;
              goto LAB_0016b3a9;
            }
            local_58 = uVar16;
            local_40 = pbVar18;
            uVar10 = htmlValidateUtf8(ctxt,str,len,local_60);
            pbVar18 = local_40;
            uVar16 = local_58;
            if ((iVar6 != 0) && (uVar10 == 0)) {
              iVar7 = 0;
              bVar23 = true;
              local_90 = uVar20;
              goto LAB_0016b2b6;
            }
            if ((int)uVar10 < 1) {
              local_6c = 1;
              local_5c = 3;
              pbVar13 = pbVar21 + uVar11;
              bVar23 = false;
              iVar7 = 1;
              local_48 = (xmlChar *)anon_var_dwarf_11e17;
              local_90 = (ulong)(iVar12 + iVar14 + 1);
              goto LAB_0016b2b6;
            }
            iVar7 = 0;
            local_90 = local_50;
            goto LAB_0016ac4f;
          }
          local_38 = local_38 + 1;
          local_90 = 1;
        }
        else {
          uVar2 = uVar8 - 2;
          if (bVar3 == 0x26) {
            if (mode < 2) {
              if (uVar1 == uVar11) {
                local_90 = uVar20;
                if (local_60 != 0) goto LAB_0016b5f1;
                goto LAB_0016ada6;
              }
              if (pbVar21[uVar11 + 1] != 0x23) {
                if (local_60 == 0) goto LAB_0016ada6;
                uVar19 = 1;
                goto LAB_0016b022;
              }
              uVar10 = 1;
              uVar8 = 2;
              if (uVar2 != uVar11) {
                if ((pbVar21[uVar11 + 2] & 0xdf) != 0x58) {
                  iVar7 = 0;
                  if ((byte)(pbVar21[uVar11 + 2] - 0x30) < 10) {
                    local_9c = 0;
                    uVar15 = 2;
                    iVar7 = 10;
                    uVar10 = 2;
                  }
                  goto LAB_0016ae1c;
                }
                uVar8 = 3;
                if ((3 < len) &&
                   (((byte)(pbVar21[uVar11 + 3] - 0x30) < 10 ||
                    ((byte)((pbVar21[uVar11 + 3] | 0x20) + 0x9f) < 6)))) {
                  local_9c = 0;
                  uVar15 = 3;
                  iVar7 = 0x10;
                  uVar10 = 3;
                  goto LAB_0016ae1c;
                }
              }
              iVar7 = 0;
              goto LAB_0016ae1c;
            }
          }
          else if (bVar3 == 0x2d) {
            if (0xfffffffd < mode - 7) {
              uVar8 = 1;
              if ((((uVar1 != uVar11) && (pbVar21[uVar11 + 1] == 0x2d)) &&
                  (uVar8 = 2, uVar2 != uVar11)) && (pbVar21[uVar11 + 2] == 0x3e)) {
                mode = 4;
              }
              if ((local_60 != 0) && (local_90 = uVar20, len <= uVar8)) goto LAB_0016b5f1;
              uVar10 = 1;
              iVar7 = 0;
              local_90 = local_50;
              goto LAB_0016ac4f;
            }
          }
          else {
            if (bVar3 != 0x3c) goto LAB_0016ad5c;
            if (mode != 3) {
              bVar23 = true;
              if (mode == 0) {
                local_54 = 1;
                local_90 = uVar20;
                goto LAB_0016b524;
              }
              uVar8 = 1;
              uVar10 = mode;
              if (uVar1 == uVar11) goto LAB_0016b171;
              bVar3 = pbVar21[uVar11 + 1];
              if ((mode == 4) && (bVar3 == 0x21)) {
                uVar10 = 4;
                uVar8 = 2;
                if ((uVar2 != uVar11) && ((pbVar21[uVar11 + 2] == 0x2d && (uVar8 = 3, 3 < len)))) {
                  uVar10 = pbVar21[uVar11 + 3] == 0x2d | 4;
                }
                goto LAB_0016b171;
              }
              uVar11 = (ulong)(bVar3 == 0x2f) + 1;
              uVar8 = uVar11;
              if ((bVar3 != 0x2f && mode != 5) || (len <= uVar11)) goto LAB_0016b171;
              uVar19 = 0;
              goto LAB_0016b0ad;
            }
          }
        }
        iVar7 = 0;
        uVar10 = 1;
        goto LAB_0016ac4f;
      }
      uVar20 = (ulong)((int)uVar20 + 1);
      pbVar13 = pbVar13 + 1;
      uVar11 = uVar11 + 1;
    } while (uVar8 != uVar11);
    len = 0;
    local_90 = (ulong)(uint)((int)uVar8 + iVar12);
LAB_0016ac82:
    iVar7 = 0;
    pbVar13 = str;
    goto LAB_0016ac87;
  }
  bVar3 = *pbVar21;
  local_90 = (ulong)(iVar12 + 1);
  if ((byte)(bVar3 - 0x30) < 10) {
    iVar6 = bVar3 - 0x30;
  }
  else {
    if ((iVar7 != 0x10) || (uVar10 = bVar3 | 0x20, 5 < uVar10 - 0x61)) {
      uVar10 = (uint)(bVar3 == 0x3b);
      pbVar13 = pbVar21 + uVar10;
      uVar15 = (ulong)(iVar14 + uVar10);
      goto LAB_0016b2a9;
    }
    iVar6 = uVar10 - 0x57;
  }
  local_9c = local_9c * iVar7 + iVar6;
  if (0x10ffff < local_9c) {
    local_9c = 0x110000;
  }
  uVar15 = (ulong)(iVar14 + 1);
  uVar10 = 1;
  len = uVar8;
  str = pbVar21;
  goto LAB_0016ac4f;
  while ((uVar1 = uVar19 + 1, uVar1 < len && (bVar23 = uVar19 < 0x1f, uVar19 = uVar1, bVar23))) {
LAB_0016b022:
    if ((0x19 < (byte)((pbVar13[uVar19] | 0x20) + 0x9f)) &&
       ((uVar19 < 2 || (9 < (byte)(pbVar13[uVar19] - 0x30))))) goto LAB_0016ada6;
  }
  if (len <= uVar1) {
    pbVar13 = pbVar21 + uVar11;
    local_90 = (ulong)(iVar12 + iVar14 + 1);
LAB_0016b5f1:
    bVar23 = true;
    iVar7 = 0;
    goto LAB_0016b2b6;
  }
LAB_0016ada6:
  local_58 = uVar16;
  local_40 = pbVar18;
  local_48 = htmlFindEntityPrefix(pbVar21 + uVar11 + 1,~uVar11 + uVar8,0,&local_6c,&local_5c);
  pbVar18 = local_40;
  uVar16 = local_58;
  if (local_48 != (xmlChar *)0x0) {
    iVar7 = local_6c + 1;
    pbVar13 = pbVar21 + uVar11;
    local_90 = (ulong)(iVar12 + iVar14 + 1);
    bVar23 = false;
    pxVar22 = local_68;
    local_6c = iVar7;
    goto LAB_0016b2b6;
  }
  local_6c = 0;
  uVar10 = 1;
  uVar8 = 1;
  local_48 = (xmlChar *)0x0;
  iVar7 = 0;
LAB_0016ae1c:
  local_90 = local_50;
  if ((local_60 != 0) && (len <= uVar8)) {
    iVar7 = 0;
    bVar23 = true;
    pxVar22 = local_68;
    local_90 = uVar20;
    goto LAB_0016b2b6;
  }
LAB_0016ac4f:
  len = len - uVar10;
  pbVar13 = str + uVar10;
LAB_0016ac87:
  if (1 < ctxt->disableSAX) goto LAB_0016b2a9;
  goto LAB_0016ab4d;
  while (lVar17 = uVar11 + uVar19, uVar19 = uVar19 + 1, uVar8 = len, lVar17 + 1U < len) {
LAB_0016b0ad:
    bVar4 = ctxt->name[uVar19];
    if ((bVar4 == 0) || (bVar4 != (pbVar13[uVar19 + uVar11] | 0x20))) {
      uVar8 = uVar11 + uVar19;
      if (ctxt->name[uVar19 & 0xffffffff] == '\0') {
        bVar4 = pbVar13[uVar19 + uVar11];
        if (((((ulong)bVar4 < 0x3f) && ((0x4000800100000000U >> ((ulong)bVar4 & 0x3f) & 1) != 0)) ||
            (bVar4 != 0xb && (byte)(bVar4 - 9) < 5)) &&
           (((mode != 5 || (uVar10 = 6, bVar3 == 0x2f)) && (uVar10 = 5, mode != 6)))) {
          iVar7 = 0;
          local_54 = 1;
          local_90 = uVar20;
          goto LAB_0016b2b6;
        }
      }
      break;
    }
  }
LAB_0016b171:
  mode = uVar10;
  if ((local_60 != 0) && (len <= uVar8)) {
    iVar7 = 0;
    local_90 = uVar20;
    goto LAB_0016b2b6;
  }
  uVar10 = 1;
  iVar7 = 0;
  goto LAB_0016ac4f;
LAB_0016b2a9:
  bVar23 = false;
LAB_0016b2b1:
  iVar7 = 0;
  pxVar22 = local_68;
LAB_0016b2b6:
  iVar14 = (int)uVar15;
  if (0 < iVar14) {
    pbVar13 = pbVar13 + -uVar15;
    local_6c = iVar14;
    htmlCodePointToUtf8(local_9c,local_34,&local_5c);
    iVar7 = iVar14;
    local_48 = local_34;
  }
LAB_0016b2f6:
  pxVar9 = pxVar22->cur;
  lVar17 = (long)pbVar13 - (long)pbVar18;
  if (pbVar18 <= pbVar13 && lVar17 != 0) {
    pxVar22->cur = pxVar9 + lVar17;
    htmlCharDataSAXCallback(ctxt,pbVar18,(int)lVar17,mode);
    pxVar9 = pxVar22->cur;
    iVar7 = local_6c;
  }
  pxVar22->cur = pxVar9 + iVar7;
  if (0 < local_5c) {
    htmlCharDataSAXCallback(ctxt,local_48,local_5c,mode);
  }
  pxVar5 = ctxt->input;
  if ((((pxVar5->flags & 0x40) == 0) && (500 < (long)pxVar5->cur - (long)pxVar5->base)) &&
     ((long)pxVar5->end - (long)pxVar5->cur < 500)) {
    xmlParserShrink(ctxt);
  }
  uVar10 = (uint)local_90;
  if (bVar23) goto LAB_0016b674;
LAB_0016b3a9:
  uVar10 = (uint)local_90;
  if (1 < ctxt->disableSAX) goto LAB_0016b674;
  goto LAB_0016ab22;
}

Assistant:

static int
htmlParseCharData(htmlParserCtxtPtr ctxt, int partial) {
    xmlParserInputPtr input = ctxt->input;
    xmlChar utf8Char[4];
    int complete = 0;
    int done = 0;
    int mode;
    int eof = PARSER_PROGRESSIVE(ctxt);
    int line, col;

    mode = ctxt->endCheckState;

    line = input->line;
    col = input->col;

    while (!PARSER_STOPPED(ctxt)) {
        const xmlChar *chunk, *in, *repl;
        size_t avail;
        int replSize;
        int skip = 0;
        int ncr = 0;
        int ncrSize = 0;
        int cp = 0;

        chunk = input->cur;
        avail = input->end - chunk;
        in = chunk;

        repl = BAD_CAST "";
        replSize = 0;

        while (!PARSER_STOPPED(ctxt)) {
            size_t j;
            int cur, size;

            if (avail <= 64) {
                if (!eof) {
                    size_t oldAvail = avail;
                    size_t off = in - chunk;

                    input->cur = in;

                    xmlParserGrow(ctxt);

                    in = input->cur;
                    chunk = in - off;
                    input->cur = chunk;
                    avail = input->end - in;

                    if (oldAvail == avail)
                        eof = 1;
                }

                if (avail == 0) {
                    if ((partial) && (ncr)) {
                        in -= ncrSize;
                        ncrSize = 0;
                    }

                    done = 1;
                    break;
                }
            }

            /* Accelerator */
            if (!ncr) {
                while (avail > 0) {
                    static const unsigned mask[8] = {
                        0x00002401, 0x10002040,
                        0x00000000, 0x00000000,
                        0xFFFFFFFF, 0xFFFFFFFF,
                        0xFFFFFFFF, 0xFFFFFFFF
                    };
                    cur = *in;
                    if ((1u << (cur & 0x1F)) & mask[cur >> 5])
                        break;
                    col += 1;
                    in += 1;
                    avail -= 1;
                }

                if ((!eof) && (avail <= 64))
                    continue;
                if (avail == 0)
                    continue;
            }

            cur = *in;
            size = 1;
            col += 1;

            if (ncr) {
                int lc = cur | 0x20;
                int digit;

                if ((cur >= '0') && (cur <= '9')) {
                    digit = cur - '0';
                } else if ((ncr == 16) && (lc >= 'a') && (lc <= 'f')) {
                    digit = (lc - 'a') + 10;
                } else {
                    if (cur == ';') {
                        in += 1;
                        size += 1;
                        ncrSize += 1;
                    }
                    goto next_chunk;
                }

                cp = cp * ncr + digit;
                if (cp >= 0x110000)
                    cp = 0x110000;

                ncrSize += 1;

                goto next_char;
            }

            switch (cur) {
            case '<':
                if (mode == 0) {
                    done = 1;
                    complete = 1;
                    goto next_chunk;
                }
                if (mode == DATA_PLAINTEXT)
                    break;

                j = 1;
                if (j < avail) {
                    if ((mode == DATA_SCRIPT) && (in[j] == '!')) {
                        /* Check for comment start */

                        j += 1;
                        if ((j < avail) && (in[j] == '-')) {
                            j += 1;
                            if ((j < avail) && (in[j] == '-'))
                                mode = DATA_SCRIPT_ESC1;
                        }
                    } else {
                        int i = 0;
                        int solidus = 0;

                        /* Check for tag */

                        if (in[j] == '/') {
                            j += 1;
                            solidus = 1;
                        }

                        if ((solidus) || (mode == DATA_SCRIPT_ESC1)) {
                            while ((j < avail) &&
                                   (ctxt->name[i] != 0) &&
                                   (ctxt->name[i] == (in[j] | 0x20))) {
                                i += 1;
                                j += 1;
                            }

                            if ((ctxt->name[i] == 0) && (j < avail)) {
                                int c = in[j];

                                if ((c == '>') || (c == '/') ||
                                    (IS_WS_HTML(c))) {
                                    if ((mode == DATA_SCRIPT_ESC1) &&
                                        (!solidus)) {
                                        mode = DATA_SCRIPT_ESC2;
                                    } else if (mode == DATA_SCRIPT_ESC2) {
                                        mode = DATA_SCRIPT_ESC1;
                                    } else {
                                        complete = 1;
                                        done = 1;
                                        goto next_chunk;
                                    }
                                }
                            }
                        }
                    }
                }

                if ((partial) && (j >= avail)) {
                    done = 1;
                    goto next_chunk;
                }

                break;

            case '-':
                if ((mode != DATA_SCRIPT_ESC1) && (mode != DATA_SCRIPT_ESC2))
                    break;

                /* Check for comment end */

                j = 1;
                if ((j < avail) && (in[j] == '-')) {
                    j += 1;
                    if ((j < avail) && (in[j] == '>'))
                        mode = DATA_SCRIPT;
                }

                if ((partial) && (j >= avail)) {
                    done = 1;
                    goto next_chunk;
                }

                break;

            case '&':
                if ((mode != 0) && (mode != DATA_RCDATA))
                    break;

                j = 1;

                if ((j < avail) && (in[j] == '#')) {
                    j += 1;
                    if (j < avail) {
                        if ((in[j] | 0x20) == 'x') {
                            j += 1;
                            if ((j < avail) && (IS_HEX_DIGIT(in[j]))) {
                                ncr = 16;
                                size = 3;
                                ncrSize = 3;
                                cp = 0;
                            }
                        } else if (IS_ASCII_DIGIT(in[j])) {
                            ncr = 10;
                            size = 2;
                            ncrSize = 2;
                            cp = 0;
                        }
                    }
                } else {
                    if (partial) {
                        int terminated = 0;
                        size_t i;

                        /*
                         * &CounterClockwiseContourIntegral; has 33 bytes.
                         */
                        for (i = 1; i < avail; i++) {
                            if ((i >= 32) ||
                                (!IS_ASCII_LETTER(in[i]) &&
                                 ((i < 2) || !IS_ASCII_DIGIT(in[i])))) {
                                terminated = 1;
                                break;
                            }
                        }

                        if (!terminated) {
                            done = 1;
                            goto next_chunk;
                        }
                    }

                    repl = htmlFindEntityPrefix(in + j,
                                                avail - j,
                                                /* isAttr */ 0,
                                                &skip, &replSize);
                    if (repl != NULL) {
                        skip += 1;
                        goto next_chunk;
                    }

                    skip = 0;
                }

                if ((partial) && (j >= avail)) {
                    done = 1;
                    goto next_chunk;
                }

                break;

            case '\0':
                skip = 1;
                repl = BAD_CAST "\xEF\xBF\xBD";
                replSize = 3;
                goto next_chunk;

            case '\n':
                line += 1;
                col = 1;
                break;

            case '\r':
                if (partial && avail < 2) {
                    done = 1;
                    goto next_chunk;
                }

                skip = 1;
                if (in[1] != 0x0A) {
                    repl = BAD_CAST "\x0A";
                    replSize = 1;
                }
                goto next_chunk;

            default:
                if (cur < 0x80)
                    break;

                if ((input->flags & XML_INPUT_HAS_ENCODING) == 0) {
                    xmlChar * guess;

                    if (in > chunk)
                        goto next_chunk;

#ifdef FUZZING_BUILD_MODE_UNSAFE_FOR_PRODUCTION
                    guess = NULL;
#else
                    guess = htmlFindEncoding(ctxt);
#endif
                    if (guess == NULL) {
                        xmlSwitchEncoding(ctxt, XML_CHAR_ENCODING_8859_1);
                    } else {
                        xmlSwitchEncodingName(ctxt, (const char *) guess);
                        xmlFree(guess);
                    }
                    input->flags |= XML_INPUT_HAS_ENCODING;

                    eof = PARSER_PROGRESSIVE(ctxt);
                    goto restart;
                }

                size = htmlValidateUtf8(ctxt, in, avail, partial);

                if ((partial) && (size == 0)) {
                    done = 1;
                    goto next_chunk;
                }

                if (size <= 0) {
                    skip = 1;
                    repl = BAD_CAST "\xEF\xBF\xBD";
                    replSize = 3;
                    goto next_chunk;
                }

                break;
            }

next_char:
            in += size;
            avail -= size;
        }

next_chunk:
        if (ncrSize > 0) {
            skip = ncrSize;
            in -= ncrSize;

            repl = htmlCodePointToUtf8(cp, utf8Char, &replSize);
        }

        if (in > chunk) {
            input->cur += in - chunk;
            htmlCharDataSAXCallback(ctxt, chunk, in - chunk, mode);
        }

        input->cur += skip;
        if (replSize > 0)
            htmlCharDataSAXCallback(ctxt, repl, replSize, mode);

        SHRINK;

        if (done)
            break;

restart:
        ;
    }

    input->line = line;
    input->col = col;

    if (complete)
        ctxt->endCheckState = 0;
    else
        ctxt->endCheckState = mode;

    return(complete);
}